

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  char *pOld;
  sqlite3 *psVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  
  if (bPreserve == 0 || pMem->szMalloc < 1) {
    if (0 < pMem->szMalloc) {
      pcVar3 = pMem->zMalloc;
      goto LAB_00136934;
    }
LAB_00136940:
    if (pMem->db == (sqlite3 *)0x0) {
      pcVar3 = (char *)sqlite3Malloc((long)n);
    }
    else {
      pcVar3 = (char *)sqlite3DbMallocRawNN(pMem->db,(long)n);
    }
    pMem->zMalloc = pcVar3;
    bVar4 = bPreserve == 0;
  }
  else {
    pOld = pMem->z;
    pcVar3 = pMem->zMalloc;
    if (pOld != pcVar3) {
LAB_00136934:
      sqlite3DbFreeNN(pMem->db,pcVar3);
      goto LAB_00136940;
    }
    if (pMem->db == (sqlite3 *)0x0) {
      pcVar3 = (char *)sqlite3Realloc(pOld,(long)n);
      pMem->zMalloc = pcVar3;
      if (pcVar3 == (char *)0x0) {
        sqlite3_free(pMem->z);
        pcVar3 = pMem->zMalloc;
      }
    }
    else {
      pcVar3 = (char *)sqlite3DbReallocOrFree(pMem->db,pOld,(long)n);
      pMem->zMalloc = pcVar3;
    }
    pMem->z = pcVar3;
    bVar4 = true;
  }
  if (pcVar3 == (char *)0x0) {
    if ((pMem->flags & 0x9000) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    return 7;
  }
  psVar1 = pMem->db;
  if ((psVar1 != (sqlite3 *)0x0) && (pcVar3 < (psVar1->lookaside).pEnd)) {
    uVar2 = 0x80;
    if ((psVar1->lookaside).pMiddle <= pcVar3) goto LAB_001369a2;
    if ((psVar1->lookaside).pStart <= pcVar3) {
      uVar2 = (uint)(psVar1->lookaside).szTrue;
      goto LAB_001369a2;
    }
  }
  uVar2 = (*sqlite3Config.m.xSize)(pcVar3);
LAB_001369a2:
  pMem->szMalloc = uVar2;
  if ((!bVar4) && (pMem->z != (char *)0x0)) {
    memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
  }
  uVar2._0_2_ = pMem->flags;
  uVar2._2_1_ = pMem->enc;
  uVar2._3_1_ = pMem->eSubtype;
  if ((uVar2 >> 0xc & 1) != 0) {
    (*pMem->xDel)(pMem->z);
    uVar2._0_2_ = pMem->flags;
  }
  pMem->z = pMem->zMalloc;
  pMem->flags = (ushort)uVar2 & 0x8fff;
  return 0;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || (pMem->flags==MEM_Undefined
           && pMem->szMalloc<=sqlite3DbMallocSize(pMem->db,pMem->zMalloc))
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db,pMem->zMalloc));
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    if( pMem->db ){
      pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    }else{
      pMem->zMalloc = sqlite3Realloc(pMem->z, n);
      if( pMem->zMalloc==0 ) sqlite3_free(pMem->z);
      pMem->z = pMem->zMalloc;
    }
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}